

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O0

int __thiscall
slang::parsing::Token::clone(Token *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  byte bVar1;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> trivia;
  string_view rawText;
  byte *__dest;
  byte *__src;
  size_t __n;
  pointer in_stack_00000008;
  Token result;
  undefined2 local_10;
  byte bStack_e;
  Info *local_8;
  
  trivia._M_extent._M_extent_value = (size_t)__arg;
  trivia._M_ptr = in_stack_00000008;
  rawText._M_str = (char *)___flags;
  rawText._M_len = (size_t)__child_stack;
  Token((Token *)__fn,___flags,(TokenKind)((ulong)__child_stack >> 0x30),trivia,rawText,
        (SourceLocation)this);
  bVar1 = this->field_0x2;
  __dest = Info::extra(local_8);
  __src = Info::extra(this->info);
  __n = getExtraSize(this->kind);
  memcpy(__dest,__src,__n);
  return CONCAT13((this->numFlags).raw,CONCAT12(bStack_e & 0xfe | bVar1 & 1,local_10));
}

Assistant:

Token Token::clone(BumpAllocator& alloc, std::span<Trivia const> trivia, std::string_view rawText,
                   SourceLocation location) const {
    Token result(alloc, kind, trivia, rawText, location);
    result.missing = missing;

    memcpy(result.info->extra(), info->extra(), getExtraSize(kind));
    memcpy(&result.numFlags, &numFlags, 1);

    return result;
}